

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucasemap_imp.h
# Opt level: O2

UBool icu_63::ustrcase_isLNS(UChar32 c)

{
  byte bVar1;
  int32_t iVar2;
  bool bVar3;
  
  bVar1 = u_charType_63(c);
  bVar3 = true;
  if ((0xf020e2eU >> (bVar1 & 0x1f) & 1) == 0) {
    if (bVar1 == 4) {
      iVar2 = ucase_getType_63(c);
      bVar3 = iVar2 != 0;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

inline UBool ustrcase_isLNS(UChar32 c) {
    // Letter, number, symbol,
    // or a private use code point because those are typically used as letters or numbers.
    // Consider modifier letters only if they are cased.
    const uint32_t LNS = (U_GC_L_MASK|U_GC_N_MASK|U_GC_S_MASK|U_GC_CO_MASK) & ~U_GC_LM_MASK;
    int gc = u_charType(c);
    return (U_MASK(gc) & LNS) != 0 || (gc == U_MODIFIER_LETTER && ucase_getType(c) != UCASE_NONE);
}